

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::AsyncInputStream> __thiscall
kj::Own<kj::AsyncInputStream>::attach<kj::String,kj::Own<kj::HttpHeaders>>
          (Own<kj::AsyncInputStream> *this,String *attachments,Own<kj::HttpHeaders> *attachments_1)

{
  DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  *this_00;
  Own<kj::AsyncInputStream> *values;
  String *values_1;
  Own<kj::HttpHeaders> *values_2;
  NoInfer<kj::Own<kj::HttpHeaders>_> *in_RCX;
  AsyncInputStream *extraout_RDX;
  Own<kj::AsyncInputStream> OVar1;
  DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  *bundle;
  AsyncInputStream *ptrCopy;
  Own<kj::HttpHeaders> *attachments_local_1;
  String *attachments_local;
  Own<kj::AsyncInputStream> *this_local;
  
  bundle = (DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
            *)(attachments->content).size_;
  if (bundle != (DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
                 *)0x0) {
    if (bundle == (DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
                   *)0x0) {
      bundle = (DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
                *)0x1;
    }
    this_00 = (DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
               *)operator_new(0x40);
    values = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)attachments);
    values_1 = fwd<kj::String>((NoInfer<kj::String> *)attachments_1);
    values_2 = fwd<kj::Own<kj::HttpHeaders>>(in_RCX);
    _::DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>::
    DisposableOwnedBundle(this_00,values,values_1,values_2);
    Own(this,(AsyncInputStream *)bundle,(Disposer *)this_00);
    OVar1.ptr = extraout_RDX;
    OVar1.disposer = (Disposer *)this;
    return OVar1;
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/memory.h"
             ,0x1fe,"ptrCopy != nullptr","\"cannot attach to null pointer\"",
             "cannot attach to null pointer");
}

Assistant:

Own<T> Own<T>::attach(Attachments&&... attachments) {
  T* ptrCopy = ptr;

  KJ_IREQUIRE(ptrCopy != nullptr, "cannot attach to null pointer");

  // HACK: If someone accidentally calls .attach() on a null pointer in opt mode, try our best to
  //   accomplish reasonable behavior: We turn the pointer non-null but still invalid, so that the
  //   disposer will still be called when the pointer goes out of scope.
  if (ptrCopy == nullptr) ptrCopy = reinterpret_cast<T*>(1);

  auto bundle = new _::DisposableOwnedBundle<Own<T>, Attachments...>(
      kj::mv(*this), kj::fwd<Attachments>(attachments)...);
  return Own<T>(ptrCopy, *bundle);
}